

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_descriptor_combo(miniscript_node_t *node,miniscript_node_t *parent)

{
  _Bool _Var1;
  int iVar2;
  
  if (parent != (miniscript_node_t *)0x0) {
    return -2;
  }
  _Var1 = has_uncompressed_key_by_child(node);
  if (_Var1) {
    iVar2 = verify_descriptor_pk(node,parent);
    return iVar2;
  }
  iVar2 = verify_descriptor_wpkh(node,(miniscript_node_t *)0x0);
  return iVar2;
}

Assistant:

static int verify_descriptor_combo(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent)
        return WALLY_EINVAL;

    /* Since the combo is of multiple return types, the return value is wpkh or pkh. */
    if (has_uncompressed_key_by_child(node)) {
        return verify_descriptor_pkh(node, parent);
    } else {
        return verify_descriptor_wpkh(node, parent);
    }
}